

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O3

void __thiscall OpenMD::RigidBody::calcRefCoords(RigidBody *this)

{
  double dVar1;
  pointer ppAVar2;
  Atom *pAVar3;
  pointer pSVar4;
  bool bVar5;
  int i_10;
  pointer ppAVar6;
  undefined8 *puVar7;
  double *pdVar8;
  uint i_8;
  int iVar9;
  Vector3<double> *pVVar10;
  uint i_6;
  long lVar11;
  SquareMatrix3<double> *pSVar12;
  uint i_2;
  pointer pVVar13;
  undefined8 *puVar14;
  double *pdVar15;
  long lVar16;
  uint j;
  long lVar17;
  long lVar18;
  uint i;
  long lVar19;
  double *pdVar20;
  uint k_1;
  ulong uVar21;
  double tmp;
  double dVar22;
  double dVar23;
  Mat3x3d Itmp;
  Vector3d evals;
  SquareMatrix3<double> result_2;
  RectMatrix<double,_3U,_3U> result_3;
  SquareMatrix3<double> result_4;
  SquareMatrix3<double> local_228;
  Vector3<double> local_1d8;
  undefined8 uStack_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  double local_188 [4];
  double local_168 [10];
  double local_118 [10];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  double local_78 [9];
  
  local_188[0] = 0.0;
  local_188[1] = 0.0;
  local_188[2] = 0.0;
  ppAVar6 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppAVar2 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar11 = (long)ppAVar2 - (long)ppAVar6 >> 3;
  (this->super_StuntDouble).mass_ = 0.0;
  if (ppAVar2 == ppAVar6) {
    dVar22 = 0.0;
  }
  else {
    pVVar13 = (this->refCoords_).
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    dVar22 = 0.0;
    lVar17 = 0;
    do {
      dVar23 = (ppAVar6[lVar17]->super_StuntDouble).mass_;
      dVar22 = dVar22 + dVar23;
      (this->super_StuntDouble).mass_ = dVar22;
      local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
      local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
      local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
      lVar19 = 0;
      do {
        local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar19] =
             (pVVar13->super_Vector<double,_3U>).data_[lVar19] * dVar23;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 3);
      lVar19 = 0;
      do {
        local_188[lVar19] =
             local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
             [lVar19] + local_188[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 3);
      lVar17 = lVar17 + 1;
      pVVar13 = pVVar13 + 1;
    } while (lVar17 != lVar11 + (ulong)(lVar11 == 0));
  }
  local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  lVar17 = 0;
  do {
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar17] =
         local_188[lVar17] / dVar22;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  (this->refCOM_).super_Vector<double,_3U>.data_[2] =
       local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
  (this->refCOM_).super_Vector<double,_3U>.data_[0] =
       local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  (this->refCOM_).super_Vector<double,_3U>.data_[1] =
       local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
  if (ppAVar2 == ppAVar6) {
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  }
  else {
    pVVar13 = (this->refCoords_).
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar17 = 0;
    do {
      lVar19 = 0;
      do {
        (pVVar13->super_Vector<double,_3U>).data_[lVar19] =
             (pVVar13->super_Vector<double,_3U>).data_[lVar19] -
             (this->refCOM_).super_Vector<double,_3U>.data_[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 3);
      lVar17 = lVar17 + 1;
      pVVar13 = pVVar13 + 1;
    } while (lVar17 != lVar11 + (ulong)(lVar11 == 0));
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_228.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    if (ppAVar2 != ppAVar6) {
      lVar17 = 0;
      lVar11 = 0;
      uVar21 = 0;
      do {
        local_1a8 = 0;
        uStack_1a0 = 0;
        local_1b8 = 0.0;
        uStack_1b0 = 0;
        local_1d8.super_Vector<double,_3U>.data_[2] = 0.0;
        uStack_1c0 = 0;
        local_1d8.super_Vector<double,_3U>.data_[0] = 0.0;
        local_1d8.super_Vector<double,_3U>.data_[1] = 0.0;
        local_198 = 0.0;
        pAVar3 = ppAVar6[uVar21];
        dVar22 = (pAVar3->super_StuntDouble).mass_;
        pVVar13 = (this->refCoords_).
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_168[8] = 0.0;
        local_168[6] = 0.0;
        local_168[7] = 0.0;
        local_168[4] = 0.0;
        local_168[5] = 0.0;
        local_168[2] = 0.0;
        local_168[3] = 0.0;
        local_168[0] = 0.0;
        local_168[1] = 0.0;
        pdVar8 = local_168;
        lVar19 = 0;
        do {
          dVar23 = pVVar13[uVar21].super_Vector<double,_3U>.data_[lVar19];
          lVar18 = 0;
          do {
            pdVar8[lVar18] =
                 *(double *)((long)(pVVar13->super_Vector<double,_3U>).data_ + lVar18 * 8 + lVar11)
                 * dVar23;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          lVar19 = lVar19 + 1;
          pdVar8 = pdVar8 + 3;
        } while (lVar19 != 3);
        local_118[6] = 0.0;
        local_118[7] = 0.0;
        local_118[4] = 0.0;
        local_118[5] = 0.0;
        local_118[2] = 0.0;
        local_118[3] = 0.0;
        local_118[0] = 0.0;
        local_118[1] = 0.0;
        local_118[8] = 0.0;
        pdVar8 = local_168;
        lVar19 = 0;
        pdVar15 = local_118;
        do {
          lVar18 = 0;
          do {
            pdVar15[lVar18] = pdVar8[lVar18] * dVar22;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          lVar19 = lVar19 + 1;
          pdVar15 = pdVar15 + 3;
          pdVar8 = pdVar8 + 3;
        } while (lVar19 != 3);
        pVVar10 = &local_1d8;
        lVar19 = 0;
        pdVar8 = local_118;
        do {
          lVar18 = 0;
          do {
            (pVVar10->super_Vector<double,_3U>).data_[lVar18] =
                 (pVVar10->super_Vector<double,_3U>).data_[lVar18] - pdVar8[lVar18];
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          lVar19 = lVar19 + 1;
          pVVar10 = pVVar10 + 1;
          pdVar8 = pdVar8 + 3;
        } while (lVar19 != 3);
        dVar23 = 0.0;
        lVar19 = 0;
        do {
          dVar1 = *(double *)((long)(pVVar13->super_Vector<double,_3U>).data_ + lVar19 * 8 + lVar11)
          ;
          dVar23 = dVar23 + dVar1 * dVar1;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 3);
        dVar22 = dVar22 * dVar23;
        local_1d8.super_Vector<double,_3U>.data_[0] =
             local_1d8.super_Vector<double,_3U>.data_[0] + dVar22;
        local_1b8 = local_1b8 + dVar22;
        local_198 = dVar22 + local_198;
        pVVar10 = &local_1d8;
        lVar19 = 0;
        pSVar12 = &local_228;
        do {
          lVar18 = 0;
          do {
            *(double *)((long)pSVar12 + lVar18 * 8) =
                 (pVVar10->super_Vector<double,_3U>).data_[lVar18] +
                 *(double *)((long)pSVar12 + lVar18 * 8);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          lVar19 = lVar19 + 1;
          pSVar12 = (SquareMatrix3<double> *)((long)pSVar12 + 0x18);
          pVVar10 = pVVar10 + 1;
        } while (lVar19 != 3);
        bVar5 = AtomType::isDirectional(pAVar3->atomType_);
        if (bVar5) {
          lVar19 = (long)(((this->refOrients_).
                           super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_SquareMatrix<double,_3>
                         ).super_RectMatrix<double,_3U,_3U>.data_[0] + lVar17;
          local_98 = 0;
          uStack_90 = 0;
          local_a8 = 0;
          uStack_a0 = 0;
          local_b8 = 0;
          uStack_b0 = 0;
          local_c8 = 0;
          uStack_c0 = 0;
          local_88 = 0;
          puVar7 = &local_c8;
          lVar18 = 0;
          do {
            lVar16 = 0;
            puVar14 = puVar7;
            do {
              *puVar14 = *(undefined8 *)(lVar19 + lVar16 * 8);
              lVar16 = lVar16 + 1;
              puVar14 = puVar14 + 3;
            } while (lVar16 != 3);
            lVar18 = lVar18 + 1;
            puVar7 = puVar7 + 1;
            lVar19 = lVar19 + 0x18;
          } while (lVar18 != 3);
          (*((this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar21]->super_StuntDouble)._vptr_StuntDouble
            [5])(local_78);
          local_168[6] = 0.0;
          local_168[7] = 0.0;
          local_168[4] = 0.0;
          local_168[5] = 0.0;
          local_168[2] = 0.0;
          local_168[3] = 0.0;
          local_168[0] = 0.0;
          local_168[1] = 0.0;
          local_168[8] = 0.0;
          puVar7 = &local_c8;
          lVar19 = 0;
          do {
            lVar18 = 0;
            pdVar8 = local_78;
            do {
              dVar22 = local_168[lVar19 * 3 + lVar18];
              lVar16 = 0;
              pdVar15 = pdVar8;
              do {
                dVar22 = dVar22 + (double)puVar7[lVar16] * *pdVar15;
                lVar16 = lVar16 + 1;
                pdVar15 = pdVar15 + 3;
              } while (lVar16 != 3);
              local_168[lVar19 * 3 + lVar18] = dVar22;
              lVar18 = lVar18 + 1;
              pdVar8 = pdVar8 + 1;
            } while (lVar18 != 3);
            lVar19 = lVar19 + 1;
            puVar7 = puVar7 + 3;
          } while (lVar19 != 3);
          pSVar4 = (this->refOrients_).
                   super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_118[6] = 0.0;
          local_118[7] = 0.0;
          local_118[4] = 0.0;
          local_118[5] = 0.0;
          local_118[2] = 0.0;
          local_118[3] = 0.0;
          local_118[0] = 0.0;
          local_118[1] = 0.0;
          local_118[8] = 0.0;
          pdVar8 = local_168;
          lVar19 = 0;
          do {
            lVar18 = 0;
            pdVar15 = (double *)
                      ((long)(pSVar4->super_SquareMatrix<double,_3>).
                             super_RectMatrix<double,_3U,_3U>.data_[0] + lVar17);
            do {
              dVar22 = local_118[lVar19 * 3 + lVar18];
              lVar16 = 0;
              pdVar20 = pdVar15;
              do {
                dVar22 = dVar22 + pdVar8[lVar16] * *pdVar20;
                lVar16 = lVar16 + 1;
                pdVar20 = pdVar20 + 3;
              } while (lVar16 != 3);
              local_118[lVar19 * 3 + lVar18] = dVar22;
              lVar18 = lVar18 + 1;
              pdVar15 = pdVar15 + 1;
            } while (lVar18 != 3);
            lVar19 = lVar19 + 1;
            pdVar8 = pdVar8 + 3;
          } while (lVar19 != 3);
          lVar19 = 0;
          pdVar8 = local_118;
          pSVar12 = &local_228;
          do {
            lVar18 = 0;
            do {
              *(double *)((long)pSVar12 + lVar18 * 8) =
                   pdVar8[lVar18] + *(double *)((long)pSVar12 + lVar18 * 8);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            lVar19 = lVar19 + 1;
            pSVar12 = (SquareMatrix3<double> *)((long)pSVar12 + 0x18);
            pdVar8 = pdVar8 + 3;
          } while (lVar19 != 3);
        }
        uVar21 = uVar21 + 1;
        ppAVar6 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x18;
        lVar17 = lVar17 + 0x48;
      } while (uVar21 < (ulong)((long)(this->atoms_).
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar6 >>
                               3));
    }
  }
  local_1d8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1d8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_1d8.super_Vector<double,_3U>.data_[2] = 0.0;
  SquareMatrix3<double>::diagonalize(&local_228,&local_1d8,&this->sU_);
  (this->inertiaTensor_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
       = local_1d8.super_Vector<double,_3U>.data_[0];
  (this->inertiaTensor_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1]
       = local_1d8.super_Vector<double,_3U>.data_[1];
  (this->inertiaTensor_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2]
       = local_1d8.super_Vector<double,_3U>.data_[2];
  lVar11 = 0;
  iVar9 = 0;
  do {
    if (ABS(local_1d8.super_Vector<double,_3U>.data_[lVar11]) < 1e-06) {
      (this->super_StuntDouble).linear_ = true;
      (this->super_StuntDouble).linearAxis_ = (int)lVar11;
      iVar9 = iVar9 + 1;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  if (1 < iVar9) {
    memcpy(&painCave,
           "RigidBody error.\n\tOpenMD found more than one axis in this rigid body with a vanishing \n\tmoment of inertia.  This can happen in one of three ways:\n\t 1) Only one atom was specified, or \n\t 2) All atoms were specified at the same location, or\n\t 3) The programmers did something stupid.\n\tIt is silly to use a rigid body to describe this situation.  Be smarter.\n"
           ,0x165);
    painCave.isFatal = 1;
    simError();
  }
  return;
}

Assistant:

void RigidBody::calcRefCoords() {
    RealType mtmp;
    Vector3d refCOM(0.0);
    mass_ = 0.0;
    for (std::size_t i = 0; i < atoms_.size(); ++i) {
      mtmp = atoms_[i]->getMass();
      mass_ += mtmp;
      refCOM += refCoords_[i] * mtmp;
    }
    refCOM_ = refCOM / mass_;

    // Next, move the origin of the reference coordinate system to the COM:
    for (std::size_t i = 0; i < atoms_.size(); ++i) {
      refCoords_[i] -= refCOM_;
    }

    // Moment of Inertia calculation
    Mat3x3d Itmp(0.0);
    for (std::size_t i = 0; i < atoms_.size(); i++) {
      Mat3x3d IAtom(0.0);
      mtmp = atoms_[i]->getMass();
      IAtom -= outProduct(refCoords_[i], refCoords_[i]) * mtmp;
      RealType r2 = refCoords_[i].lengthSquare();
      IAtom(0, 0) += mtmp * r2;
      IAtom(1, 1) += mtmp * r2;
      IAtom(2, 2) += mtmp * r2;
      Itmp += IAtom;

      // project the inertial moment of directional atoms into this rigid body
      if (atoms_[i]->isDirectional()) {
        Itmp += refOrients_[i].transpose() * atoms_[i]->getI() * refOrients_[i];
      }
    }

    // diagonalize
    Vector3d evals;
    Mat3x3d::diagonalize(Itmp, evals, sU_);

    // zero out I and then fill the diagonals with the moments of inertia:
    inertiaTensor_(0, 0) = evals[0];
    inertiaTensor_(1, 1) = evals[1];
    inertiaTensor_(2, 2) = evals[2];

    int nLinearAxis = 0;
    for (int i = 0; i < 3; i++) {
      if (fabs(evals[i]) < OpenMD::epsilon) {
        linear_     = true;
        linearAxis_ = i;
        ++nLinearAxis;
      }
    }

    if (nLinearAxis > 1) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "RigidBody error.\n"
          "\tOpenMD found more than one axis in this rigid body with a "
          "vanishing \n"
          "\tmoment of inertia.  This can happen in one of three ways:\n"
          "\t 1) Only one atom was specified, or \n"
          "\t 2) All atoms were specified at the same location, or\n"
          "\t 3) The programmers did something stupid.\n"
          "\tIt is silly to use a rigid body to describe this situation.  Be "
          "smarter.\n");
      painCave.isFatal = 1;
      simError();
    }
  }